

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_SSLPending_Test::TestBody(SSLVersionTest_SSLPending_Test *this)

{
  bool bVar1;
  pointer ctx;
  SSL *pSVar2;
  char *pcVar3;
  pointer psVar4;
  char *in_R9;
  AssertHelper local_440;
  Message local_438;
  int local_430 [2];
  undefined1 local_428 [8];
  AssertionResult gtest_ar_19;
  Message local_410;
  int local_408 [2];
  undefined1 local_400 [8];
  AssertionResult gtest_ar_18;
  Message local_3e8;
  int local_3e0 [2];
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_17;
  Message local_3c0;
  int local_3b8 [2];
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_16;
  Message local_398;
  int local_390 [2];
  undefined1 local_388 [8];
  AssertionResult gtest_ar_15;
  Message local_370;
  int local_368 [2];
  undefined1 local_360 [8];
  AssertionResult gtest_ar_14;
  Message local_348;
  int local_340 [2];
  undefined1 local_338 [8];
  AssertionResult gtest_ar_13;
  Message local_320;
  int local_318 [2];
  undefined1 local_310 [8];
  AssertionResult gtest_ar_12;
  Message local_2f8;
  int local_2f0 [2];
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_11;
  Message local_2d0;
  int local_2c8 [2];
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_10;
  Message local_2a8;
  int local_2a0 [2];
  undefined1 local_298 [8];
  AssertionResult gtest_ar_9;
  Message local_280;
  int local_278 [2];
  undefined1 local_270 [8];
  AssertionResult gtest_ar_8;
  Message local_258;
  int local_250 [2];
  undefined1 local_248 [8];
  AssertionResult gtest_ar_7;
  char buf [10];
  Message local_220;
  int local_218 [2];
  undefined1 local_210 [8];
  AssertionResult gtest_ar_6;
  Message local_1f8;
  int local_1f0 [2];
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_5;
  Message local_1d0;
  int local_1c8 [2];
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_4;
  Message local_1a8;
  int local_1a0 [2];
  undefined1 local_198 [8];
  AssertionResult gtest_ar_3;
  Message local_180;
  int local_178 [2];
  undefined1 local_170 [8];
  AssertionResult gtest_ar_2;
  Message local_158;
  int local_150 [2];
  undefined1 local_148 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_118;
  Message local_110;
  ClientConfig local_108;
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  Message local_90;
  int local_88 [2];
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<SSL> ssl;
  SSLVersionTest_SSLPending_Test *this_local;
  
  ctx = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                  (&(this->super_SSLVersionTest).client_ctx_);
  pSVar2 = SSL_new((SSL_CTX *)ctx);
  std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&gtest_ar_.message_,(pointer)pSVar2);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<ssl_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x4e465b,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x170c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_88[1] = 0;
    pSVar2 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                              ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    local_88[0] = SSL_pending(pSVar2);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_80,"0","SSL_pending(ssl.get())",local_88 + 1,local_88);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x170d,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_90);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
    local_108.verify_hostname.field_2._M_allocated_capacity = 0;
    local_108.verify_hostname.field_2._8_8_ = 0;
    local_108.verify_hostname._M_dataplus = (_Alloc_hider)0x0;
    local_108.verify_hostname._1_7_ = 0;
    local_108.verify_hostname._M_string_length = 0;
    local_108.servername.field_2._M_allocated_capacity = 0;
    local_108.servername.field_2._8_8_ = 0;
    local_108.servername._M_dataplus = (_Alloc_hider)0x0;
    local_108.servername._1_7_ = 0;
    local_108.servername._M_string_length = 0;
    local_108.session = (SSL_SESSION *)0x0;
    local_108.ca_names = (stack_st_CRYPTO_BUFFER *)0x0;
    local_108.hostflags = 0;
    local_108.early_data = false;
    local_108._85_3_ = 0;
    ClientConfig::ClientConfig(&local_108);
    local_a9 = SSLVersionTest::Connect(&this->super_SSLVersionTest,&local_108);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_a8,&local_a9,(type *)0x0);
    ClientConfig::~ClientConfig(&local_108);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1.message_,(internal *)local_a8,(AssertionResult *)"Connect()",
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x170f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_110);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_150[1] = 0;
      pSVar2 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                (&(this->super_SSLVersionTest).client_);
      local_150[0] = SSL_pending(pSVar2);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_148,"0","SSL_pending(client_.get())",local_150 + 1,local_150);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
      if (!bVar1) {
        testing::Message::Message(&local_158);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1710,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_158);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_158);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
      local_178[1] = 0;
      psVar4 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).client_);
      local_178[0] = SSL_has_pending(psVar4);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_170,"0","SSL_has_pending(client_.get())",local_178 + 1,local_178)
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
      if (!bVar1) {
        testing::Message::Message(&local_180);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1711,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_180);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_180);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
      local_1a0[1] = 5;
      pSVar2 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                (&(this->super_SSLVersionTest).server_);
      local_1a0[0] = SSL_write(pSVar2,"hello",5);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_198,"5","SSL_write(server_.get(), \"hello\", 5)",local_1a0 + 1,
                 local_1a0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
      if (!bVar1) {
        testing::Message::Message(&local_1a8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1713,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_1a8);
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_1c8[1] = 5;
        pSVar2 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                  (&(this->super_SSLVersionTest).server_);
        local_1c8[0] = SSL_write(pSVar2,"world",5);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_1c0,"5","SSL_write(server_.get(), \"world\", 5)",local_1c8 + 1,
                   local_1c8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
        if (!bVar1) {
          testing::Message::Message(&local_1d0);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1714,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_5.message_,&local_1d0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
          testing::Message::~Message(&local_1d0);
        }
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
        if (gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          local_1f0[1] = 0;
          pSVar2 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                    (&(this->super_SSLVersionTest).client_);
          local_1f0[0] = SSL_pending(pSVar2);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_1e8,"0","SSL_pending(client_.get())",local_1f0 + 1,local_1f0)
          ;
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
          if (!bVar1) {
            testing::Message::Message(&local_1f8);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1715,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_6.message_,&local_1f8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
            testing::Message::~Message(&local_1f8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
          local_218[1] = 0;
          psVar4 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          local_218[0] = SSL_has_pending(psVar4);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_210,"0","SSL_has_pending(client_.get())",local_218 + 1,
                     local_218);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
          if (!bVar1) {
            testing::Message::Message(&local_220);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)(buf + 2),kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1716,pcVar3);
            testing::internal::AssertHelper::operator=((AssertHelper *)(buf + 2),&local_220);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(buf + 2));
            testing::Message::~Message(&local_220);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
          local_250[1] = 1;
          pSVar2 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                    (&(this->super_SSLVersionTest).client_);
          local_250[0] = SSL_peek(pSVar2,(void *)((long)&gtest_ar_7.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 + 6),1);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_248,"1","SSL_peek(client_.get(), buf, 1)",local_250 + 1,
                     local_250);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
          if (!bVar1) {
            testing::Message::Message(&local_258);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1719,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_8.message_,&local_258);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
            testing::Message::~Message(&local_258);
          }
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
          if (gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            local_278[1] = 5;
            pSVar2 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                      (&(this->super_SSLVersionTest).client_);
            local_278[0] = SSL_pending(pSVar2);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_270,"5","SSL_pending(client_.get())",local_278 + 1,
                       local_278);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
            if (!bVar1) {
              testing::Message::Message(&local_280);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x171a,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_9.message_,&local_280);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
              testing::Message::~Message(&local_280);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
            local_2a0[1] = 1;
            psVar4 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                               (&(this->super_SSLVersionTest).client_);
            local_2a0[0] = SSL_has_pending(psVar4);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_298,"1","SSL_has_pending(client_.get())",local_2a0 + 1,
                       local_2a0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
            if (!bVar1) {
              testing::Message::Message(&local_2a8);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x171b,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_10.message_,&local_2a8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
              testing::Message::~Message(&local_2a8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
            local_2c8[1] = 1;
            pSVar2 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                      (&(this->super_SSLVersionTest).client_);
            local_2c8[0] = SSL_read(pSVar2,(void *)((long)&gtest_ar_7.message_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 6),1);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_2c0,"1","SSL_read(client_.get(), buf, 1)",local_2c8 + 1,
                       local_2c8);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
            if (!bVar1) {
              testing::Message::Message(&local_2d0);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_11.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x171d,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_11.message_,&local_2d0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
              testing::Message::~Message(&local_2d0);
            }
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
            if (gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              local_2f0[1] = 4;
              pSVar2 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                        (&(this->super_SSLVersionTest).client_);
              local_2f0[0] = SSL_pending(pSVar2);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_2e8,"4","SSL_pending(client_.get())",local_2f0 + 1,
                         local_2f0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
              if (!bVar1) {
                testing::Message::Message(&local_2f8);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x171e,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_12.message_,&local_2f8);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_12.message_);
                testing::Message::~Message(&local_2f8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
              local_318[1] = 1;
              psVar4 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                 (&(this->super_SSLVersionTest).client_);
              local_318[0] = SSL_has_pending(psVar4);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_310,"1","SSL_has_pending(client_.get())",local_318 + 1,
                         local_318);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
              if (!bVar1) {
                testing::Message::Message(&local_320);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x171f,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_13.message_,&local_320);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_13.message_);
                testing::Message::~Message(&local_320);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
              local_340[1] = 4;
              pSVar2 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                        (&(this->super_SSLVersionTest).client_);
              local_340[0] = SSL_read(pSVar2,(void *)((long)&gtest_ar_7.message_._M_t.
                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 6),10);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_338,"4","SSL_read(client_.get(), buf, 10)",local_340 + 1,
                         local_340);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
              if (!bVar1) {
                testing::Message::Message(&local_348);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_14.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x1721,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_14.message_,&local_348);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_14.message_);
                testing::Message::~Message(&local_348);
              }
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
              if (gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                local_368[1] = 0;
                pSVar2 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                          (&(this->super_SSLVersionTest).client_);
                local_368[0] = SSL_pending(pSVar2);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_360,"0","SSL_pending(client_.get())",local_368 + 1,
                           local_368);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_360);
                if (!bVar1) {
                  testing::Message::Message(&local_370);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x1722,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_15.message_,&local_370);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_15.message_);
                  testing::Message::~Message(&local_370);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
                bVar1 = SSLVersionTest::is_dtls(&this->super_SSLVersionTest);
                if (bVar1) {
                  local_390[1] = 1;
                  psVar4 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                     (&(this->super_SSLVersionTest).client_);
                  local_390[0] = SSL_has_pending(psVar4);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_388,"1","SSL_has_pending(client_.get())",
                             local_390 + 1,local_390);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_388);
                  if (!bVar1) {
                    testing::Message::Message(&local_398);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_388)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x172c,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_16.message_,&local_398);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_16.message_);
                    testing::Message::~Message(&local_398);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
                }
                else {
                  local_3b8[1] = 0;
                  psVar4 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                     (&(this->super_SSLVersionTest).client_);
                  local_3b8[0] = SSL_has_pending(psVar4);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_3b0,"0","SSL_has_pending(client_.get())",
                             local_3b8 + 1,local_3b8);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_3b0);
                  if (!bVar1) {
                    testing::Message::Message(&local_3c0);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x1730,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_17.message_,&local_3c0);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_17.message_);
                    testing::Message::~Message(&local_3c0);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
                }
                local_3e0[1] = 2;
                pSVar2 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                          (&(this->super_SSLVersionTest).client_);
                local_3e0[0] = SSL_read(pSVar2,(void *)((long)&gtest_ar_7.message_._M_t.
                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 6),2);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_3d8,"2","SSL_read(client_.get(), buf, 2)",local_3e0 + 1
                           ,local_3e0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_3d8);
                if (!bVar1) {
                  testing::Message::Message(&local_3e8);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_18.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x1733,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_18.message_,&local_3e8);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_18.message_);
                  testing::Message::~Message(&local_3e8);
                }
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
                if (gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  local_408[1] = 3;
                  pSVar2 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                            (&(this->super_SSLVersionTest).client_);
                  local_408[0] = SSL_pending(pSVar2);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_400,"3","SSL_pending(client_.get())",local_408 + 1,
                             local_408);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_400);
                  if (!bVar1) {
                    testing::Message::Message(&local_410);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_400)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x1734,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_19.message_,&local_410);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_19.message_);
                    testing::Message::~Message(&local_410);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
                  local_430[1] = 1;
                  psVar4 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                     (&(this->super_SSLVersionTest).client_);
                  local_430[0] = SSL_has_pending(psVar4);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_428,"1","SSL_has_pending(client_.get())",
                             local_430 + 1,local_430);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_428);
                  if (!bVar1) {
                    testing::Message::Message(&local_438);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_428)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              (&local_440,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x1735,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_440,&local_438);
                    testing::internal::AssertHelper::~AssertHelper(&local_440);
                    testing::Message::~Message(&local_438);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
                  gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_P(SSLVersionTest, SSLPending) {
  UniquePtr<SSL> ssl(SSL_new(client_ctx_.get()));
  ASSERT_TRUE(ssl);
  EXPECT_EQ(0, SSL_pending(ssl.get()));

  ASSERT_TRUE(Connect());
  EXPECT_EQ(0, SSL_pending(client_.get()));
  EXPECT_EQ(0, SSL_has_pending(client_.get()));

  ASSERT_EQ(5, SSL_write(server_.get(), "hello", 5));
  ASSERT_EQ(5, SSL_write(server_.get(), "world", 5));
  EXPECT_EQ(0, SSL_pending(client_.get()));
  EXPECT_EQ(0, SSL_has_pending(client_.get()));

  char buf[10];
  ASSERT_EQ(1, SSL_peek(client_.get(), buf, 1));
  EXPECT_EQ(5, SSL_pending(client_.get()));
  EXPECT_EQ(1, SSL_has_pending(client_.get()));

  ASSERT_EQ(1, SSL_read(client_.get(), buf, 1));
  EXPECT_EQ(4, SSL_pending(client_.get()));
  EXPECT_EQ(1, SSL_has_pending(client_.get()));

  ASSERT_EQ(4, SSL_read(client_.get(), buf, 10));
  EXPECT_EQ(0, SSL_pending(client_.get()));
  if (is_dtls()) {
    // In DTLS, the two records would have been read as a single datagram and
    // buffered inside |client_|. Thus, |SSL_has_pending| should return true.
    //
    // This test is slightly unrealistic. It relies on |ConnectClientAndServer|
    // using a |BIO| pair, which does not preserve datagram boundaries. Reading
    // 1 byte, then 4 bytes, from the first record also relies on
    // https://crbug.com/boringssl/65. But it does test the codepaths. When
    // fixing either of these bugs, this test may need to be redone.
    EXPECT_EQ(1, SSL_has_pending(client_.get()));
  } else {
    // In TLS, we do not overread, so |SSL_has_pending| should report no data is
    // buffered.
    EXPECT_EQ(0, SSL_has_pending(client_.get()));
  }

  ASSERT_EQ(2, SSL_read(client_.get(), buf, 2));
  EXPECT_EQ(3, SSL_pending(client_.get()));
  EXPECT_EQ(1, SSL_has_pending(client_.get()));
}